

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  undefined4 *puVar6;
  float *pfVar7;
  float *pfVar8;
  undefined4 *puVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  float *pfVar22;
  float *pfVar23;
  float *pfVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined8 uVar27;
  Scene *pSVar28;
  Geometry *pGVar29;
  long lVar30;
  long lVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined8 uVar40;
  undefined1 auVar41 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar42;
  int iVar43;
  undefined4 uVar44;
  float *vertices;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar45;
  RTCRayN *pRVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  uint uVar50;
  long lVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  uint uVar62;
  uint uVar63;
  uint uVar64;
  float fVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar83;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar92;
  float fVar100;
  float fVar101;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar95;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar104;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar107;
  float fVar110;
  float fVar111;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar121;
  float fVar123;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar119;
  float fVar122;
  float fVar124;
  undefined1 auVar120 [16];
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar132;
  float fVar134;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar133;
  float fVar135;
  undefined1 auVar131 [16];
  float fVar136;
  float fVar139;
  float fVar140;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar157;
  float fVar158;
  float fVar159;
  undefined1 auVar156 [16];
  float fVar160;
  float fVar161;
  float fVar163;
  float fVar164;
  float fVar165;
  undefined1 auVar162 [16];
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  undefined1 auVar170 [16];
  float fVar177;
  float fVar178;
  float fVar181;
  float fVar182;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  undefined1 auVar187 [16];
  UVIdentity<4> mapUV;
  float local_12e8;
  float fStack_12e4;
  float fStack_12e0;
  float fStack_12dc;
  undefined1 local_12d8 [8];
  float fStack_12d0;
  float fStack_12cc;
  Scene *scene;
  float fStack_1280;
  float fStack_127c;
  vbool<4> valid;
  float fStack_1260;
  float fStack_125c;
  undefined8 local_1258;
  undefined1 local_1208 [16];
  undefined1 (*local_11f8) [16];
  long local_11f0;
  long local_11e8;
  ulong local_11e0;
  RTCFilterFunctionNArguments args;
  undefined8 local_1188;
  undefined8 uStack_1180;
  vfloat<4> tNear;
  undefined1 local_1128 [16];
  undefined1 local_1118 [16];
  float local_1108 [4];
  undefined1 local_10f8 [16];
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [16];
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined8 local_1018;
  undefined8 uStack_1010;
  RTCHitN local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined4 local_fd8;
  undefined4 uStack_fd4;
  undefined4 uStack_fd0;
  undefined4 uStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  undefined1 local_fb8 [16];
  uint local_fa8;
  uint uStack_fa4;
  uint uStack_fa0;
  uint uStack_f9c;
  uint local_f98;
  uint uStack_f94;
  uint uStack_f90;
  uint uStack_f8c;
  uint local_f88;
  uint uStack_f84;
  uint uStack_f80;
  uint uStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  pSVar45 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar65 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar92 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar126 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar160 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar166 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar167 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar183 = fVar160 * 0.99999964;
  fVar125 = fVar166 * 0.99999964;
  fVar177 = fVar167 * 0.99999964;
  fVar160 = fVar160 * 1.0000004;
  fVar166 = fVar166 * 1.0000004;
  fVar167 = fVar167 * 1.0000004;
  uVar56 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_11e0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar61 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar52 = local_11e0 ^ 0x10;
  iVar43 = (tray->tnear).field_0.i[k];
  auVar137._4_4_ = iVar43;
  auVar137._0_4_ = iVar43;
  auVar137._8_4_ = iVar43;
  auVar137._12_4_ = iVar43;
  iVar43 = (tray->tfar).field_0.i[k];
  auVar85._4_4_ = iVar43;
  auVar85._0_4_ = iVar43;
  auVar85._8_4_ = iVar43;
  auVar85._12_4_ = iVar43;
  local_11f8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_1058 = fVar65;
  fStack_1054 = fVar65;
  fStack_1050 = fVar65;
  fStack_104c = fVar65;
  local_1068 = fVar92;
  fStack_1064 = fVar92;
  fStack_1060 = fVar92;
  fStack_105c = fVar92;
  local_1078 = fVar126;
  fStack_1074 = fVar126;
  fStack_1070 = fVar126;
  fStack_106c = fVar126;
  local_1088 = fVar160;
  fStack_1084 = fVar160;
  fStack_1080 = fVar160;
  fStack_107c = fVar160;
  local_1098 = fVar166;
  fStack_1094 = fVar166;
  fStack_1090 = fVar166;
  fStack_108c = fVar166;
  local_10a8 = fVar167;
  fStack_10a4 = fVar167;
  fStack_10a0 = fVar167;
  fStack_109c = fVar167;
  local_10b8 = fVar177;
  fStack_10b4 = fVar177;
  fStack_10b0 = fVar177;
  fStack_10ac = fVar177;
  local_10c8 = fVar183;
  fStack_10c4 = fVar183;
  fStack_10c0 = fVar183;
  fStack_10bc = fVar183;
  fVar143 = fVar183;
  fVar142 = fVar183;
  fVar141 = fVar183;
  fVar140 = fVar177;
  fVar139 = fVar177;
  fVar136 = fVar177;
  fVar135 = fVar167;
  fVar134 = fVar167;
  fVar133 = fVar167;
  fVar132 = fVar160;
  fVar128 = fVar160;
  fVar127 = fVar160;
  fVar124 = fVar126;
  fVar123 = fVar126;
  fVar122 = fVar126;
  fVar121 = fVar166;
  fVar114 = fVar166;
  fVar113 = fVar166;
  fVar112 = fVar92;
  fVar111 = fVar92;
  fVar110 = fVar92;
  fVar107 = fVar65;
  fVar101 = fVar65;
  fVar100 = fVar65;
LAB_00260723:
  do {
    pSVar42 = pSVar45 + -1;
    pSVar45 = pSVar45 + -1;
    if ((float)pSVar42->dist < *(float *)(ray + k * 4 + 0x80) ||
        (float)pSVar42->dist == *(float *)(ray + k * 4 + 0x80)) {
      uVar60 = (pSVar45->ptr).ptr;
      while ((uVar60 & 8) == 0) {
        uVar47 = uVar60 & 0xfffffffffffffff0;
        fVar144 = *(float *)(ray + k * 4 + 0x70);
        pfVar24 = (float *)(uVar47 + 0x80 + uVar56);
        pfVar23 = (float *)(uVar47 + 0x20 + uVar56);
        auVar93._0_4_ = ((*pfVar24 * fVar144 + *pfVar23) - fVar100) * fVar141;
        auVar93._4_4_ = ((pfVar24[1] * fVar144 + pfVar23[1]) - fVar101) * fVar142;
        auVar93._8_4_ = ((pfVar24[2] * fVar144 + pfVar23[2]) - fVar107) * fVar143;
        auVar93._12_4_ = ((pfVar24[3] * fVar144 + pfVar23[3]) - fVar65) * fVar183;
        auVar93 = maxps(auVar137,auVar93);
        pfVar24 = (float *)(uVar47 + 0x80 + local_11e0);
        pfVar23 = (float *)(uVar47 + 0x20 + local_11e0);
        auVar102._0_4_ = ((*pfVar24 * fVar144 + *pfVar23) - fVar110) * fVar125;
        auVar102._4_4_ = ((pfVar24[1] * fVar144 + pfVar23[1]) - fVar111) * fVar125;
        auVar102._8_4_ = ((pfVar24[2] * fVar144 + pfVar23[2]) - fVar112) * fVar125;
        auVar102._12_4_ = ((pfVar24[3] * fVar144 + pfVar23[3]) - fVar92) * fVar125;
        pfVar24 = (float *)(uVar47 + 0x80 + uVar61);
        pfVar23 = (float *)(uVar47 + 0x20 + uVar61);
        auVar118._0_4_ = ((*pfVar24 * fVar144 + *pfVar23) - fVar122) * fVar136;
        auVar118._4_4_ = ((pfVar24[1] * fVar144 + pfVar23[1]) - fVar123) * fVar139;
        auVar118._8_4_ = ((pfVar24[2] * fVar144 + pfVar23[2]) - fVar124) * fVar140;
        auVar118._12_4_ = ((pfVar24[3] * fVar144 + pfVar23[3]) - fVar126) * fVar177;
        auVar102 = maxps(auVar102,auVar118);
        tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar93,auVar102);
        pfVar24 = (float *)(uVar47 + 0x80 + (uVar56 ^ 0x10));
        pfVar23 = (float *)(uVar47 + 0x20 + (uVar56 ^ 0x10));
        auVar130._0_4_ = ((*pfVar24 * fVar144 + *pfVar23) - fVar100) * fVar127;
        auVar130._4_4_ = ((pfVar24[1] * fVar144 + pfVar23[1]) - fVar101) * fVar128;
        auVar130._8_4_ = ((pfVar24[2] * fVar144 + pfVar23[2]) - fVar107) * fVar132;
        auVar130._12_4_ = ((pfVar24[3] * fVar144 + pfVar23[3]) - fVar65) * fVar160;
        pfVar24 = (float *)(uVar47 + 0x80 + uVar52);
        pfVar23 = (float *)(uVar47 + 0x20 + uVar52);
        auVar115._0_4_ = ((*pfVar24 * fVar144 + *pfVar23) - fVar110) * fVar113;
        auVar115._4_4_ = ((pfVar24[1] * fVar144 + pfVar23[1]) - fVar111) * fVar114;
        auVar115._8_4_ = ((pfVar24[2] * fVar144 + pfVar23[2]) - fVar112) * fVar121;
        auVar115._12_4_ = ((pfVar24[3] * fVar144 + pfVar23[3]) - fVar92) * fVar166;
        pfVar24 = (float *)(uVar47 + 0x80 + (uVar61 ^ 0x10));
        pfVar23 = (float *)(uVar47 + 0x20 + (uVar61 ^ 0x10));
        auVar117._0_4_ = ((*pfVar24 * fVar144 + *pfVar23) - fVar122) * fVar133;
        auVar117._4_4_ = ((pfVar24[1] * fVar144 + pfVar23[1]) - fVar123) * fVar134;
        auVar117._8_4_ = ((pfVar24[2] * fVar144 + pfVar23[2]) - fVar124) * fVar135;
        auVar117._12_4_ = ((pfVar24[3] * fVar144 + pfVar23[3]) - fVar126) * fVar167;
        auVar102 = minps(auVar115,auVar117);
        auVar93 = minps(auVar85,auVar130);
        auVar93 = minps(auVar93,auVar102);
        if (((uint)uVar60 & 7) == 6) {
          bVar32 = (fVar144 < *(float *)(uVar47 + 0xf0) && *(float *)(uVar47 + 0xe0) <= fVar144) &&
                   tNear.field_0._0_4_ <= auVar93._0_4_;
          bVar33 = (fVar144 < *(float *)(uVar47 + 0xf4) && *(float *)(uVar47 + 0xe4) <= fVar144) &&
                   tNear.field_0._4_4_ <= auVar93._4_4_;
          bVar34 = (fVar144 < *(float *)(uVar47 + 0xf8) && *(float *)(uVar47 + 0xe8) <= fVar144) &&
                   tNear.field_0._8_4_ <= auVar93._8_4_;
          bVar35 = (fVar144 < *(float *)(uVar47 + 0xfc) && *(float *)(uVar47 + 0xec) <= fVar144) &&
                   tNear.field_0._12_4_ <= auVar93._12_4_;
        }
        else {
          bVar32 = tNear.field_0._0_4_ <= auVar93._0_4_;
          bVar33 = tNear.field_0._4_4_ <= auVar93._4_4_;
          bVar34 = tNear.field_0._8_4_ <= auVar93._8_4_;
          bVar35 = tNear.field_0._12_4_ <= auVar93._12_4_;
        }
        auVar66._0_4_ = (uint)bVar32 * -0x80000000;
        auVar66._4_4_ = (uint)bVar33 * -0x80000000;
        auVar66._8_4_ = (uint)bVar34 * -0x80000000;
        auVar66._12_4_ = (uint)bVar35 * -0x80000000;
        uVar50 = movmskps((int)local_11e0,auVar66);
        if (uVar50 == 0) {
          if (pSVar45 == stack) {
            return;
          }
          goto LAB_00260723;
        }
        uVar50 = uVar50 & 0xff;
        lVar51 = 0;
        if (uVar50 != 0) {
          for (; (uVar50 >> lVar51 & 1) == 0; lVar51 = lVar51 + 1) {
          }
        }
        uVar60 = *(ulong *)(uVar47 + lVar51 * 8);
        uVar50 = uVar50 - 1 & uVar50;
        if (uVar50 != 0) {
          uVar62 = tNear.field_0.i[lVar51];
          lVar51 = 0;
          if (uVar50 != 0) {
            for (; (uVar50 >> lVar51 & 1) == 0; lVar51 = lVar51 + 1) {
            }
          }
          uVar48 = *(ulong *)(uVar47 + lVar51 * 8);
          uVar63 = tNear.field_0.i[lVar51];
          uVar50 = uVar50 - 1 & uVar50;
          if (uVar50 == 0) {
            if (uVar62 < uVar63) {
              (pSVar45->ptr).ptr = uVar48;
              pSVar45->dist = uVar63;
              pSVar45 = pSVar45 + 1;
            }
            else {
              (pSVar45->ptr).ptr = uVar60;
              pSVar45->dist = uVar62;
              pSVar45 = pSVar45 + 1;
              uVar60 = uVar48;
            }
          }
          else {
            auVar94._8_4_ = uVar62;
            auVar94._0_8_ = uVar60;
            auVar94._12_4_ = 0;
            auVar108._8_4_ = uVar63;
            auVar108._0_8_ = uVar48;
            auVar108._12_4_ = 0;
            lVar51 = 0;
            if (uVar50 != 0) {
              for (; (uVar50 >> lVar51 & 1) == 0; lVar51 = lVar51 + 1) {
              }
            }
            uVar27 = *(undefined8 *)(uVar47 + lVar51 * 8);
            iVar43 = tNear.field_0.i[lVar51];
            auVar103._8_4_ = iVar43;
            auVar103._0_8_ = uVar27;
            auVar103._12_4_ = 0;
            auVar67._8_4_ = -(uint)((int)uVar62 < (int)uVar63);
            uVar50 = uVar50 - 1 & uVar50;
            if (uVar50 == 0) {
              auVar67._4_4_ = auVar67._8_4_;
              auVar67._0_4_ = auVar67._8_4_;
              auVar67._12_4_ = auVar67._8_4_;
              auVar116._8_4_ = uVar63;
              auVar116._0_8_ = uVar48;
              auVar116._12_4_ = 0;
              auVar117 = blendvps(auVar116,auVar94,auVar67);
              auVar93 = blendvps(auVar94,auVar108,auVar67);
              auVar68._8_4_ = -(uint)(auVar117._8_4_ < iVar43);
              auVar68._4_4_ = auVar68._8_4_;
              auVar68._0_4_ = auVar68._8_4_;
              auVar68._12_4_ = auVar68._8_4_;
              auVar109._8_4_ = iVar43;
              auVar109._0_8_ = uVar27;
              auVar109._12_4_ = 0;
              auVar102 = blendvps(auVar109,auVar117,auVar68);
              auVar117 = blendvps(auVar117,auVar103,auVar68);
              auVar69._8_4_ = -(uint)(auVar93._8_4_ < auVar117._8_4_);
              auVar69._4_4_ = auVar69._8_4_;
              auVar69._0_4_ = auVar69._8_4_;
              auVar69._12_4_ = auVar69._8_4_;
              SVar104 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar117,auVar93,auVar69);
              SVar95 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar93,auVar117,auVar69);
              *pSVar45 = SVar95;
              pSVar45[1] = SVar104;
              uVar60 = auVar102._0_8_;
              pSVar45 = pSVar45 + 2;
            }
            else {
              lVar51 = 0;
              if (uVar50 != 0) {
                for (; (uVar50 >> lVar51 & 1) == 0; lVar51 = lVar51 + 1) {
                }
              }
              auVar70._4_4_ = auVar67._8_4_;
              auVar70._0_4_ = auVar67._8_4_;
              auVar70._8_4_ = auVar67._8_4_;
              auVar70._12_4_ = auVar67._8_4_;
              auVar118 = blendvps(auVar108,auVar94,auVar70);
              auVar93 = blendvps(auVar94,auVar108,auVar70);
              auVar129._8_4_ = tNear.field_0.i[lVar51];
              auVar129._0_8_ = *(undefined8 *)(uVar47 + lVar51 * 8);
              auVar129._12_4_ = 0;
              auVar71._8_4_ = -(uint)(iVar43 < tNear.field_0.i[lVar51]);
              auVar71._4_4_ = auVar71._8_4_;
              auVar71._0_4_ = auVar71._8_4_;
              auVar71._12_4_ = auVar71._8_4_;
              auVar117 = blendvps(auVar129,auVar103,auVar71);
              auVar102 = blendvps(auVar103,auVar129,auVar71);
              auVar72._8_4_ = -(uint)(auVar93._8_4_ < auVar102._8_4_);
              auVar72._4_4_ = auVar72._8_4_;
              auVar72._0_4_ = auVar72._8_4_;
              auVar72._12_4_ = auVar72._8_4_;
              auVar130 = blendvps(auVar102,auVar93,auVar72);
              SVar95 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar93,auVar102,auVar72);
              auVar73._8_4_ = -(uint)(auVar118._8_4_ < auVar117._8_4_);
              auVar73._4_4_ = auVar73._8_4_;
              auVar73._0_4_ = auVar73._8_4_;
              auVar73._12_4_ = auVar73._8_4_;
              auVar93 = blendvps(auVar117,auVar118,auVar73);
              auVar102 = blendvps(auVar118,auVar117,auVar73);
              auVar74._8_4_ = -(uint)(auVar102._8_4_ < auVar130._8_4_);
              auVar74._4_4_ = auVar74._8_4_;
              auVar74._0_4_ = auVar74._8_4_;
              auVar74._12_4_ = auVar74._8_4_;
              SVar104 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar130,auVar102,auVar74);
              SVar119 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar102,auVar130,auVar74);
              *pSVar45 = SVar95;
              pSVar45[1] = SVar119;
              pSVar45[2] = SVar104;
              uVar60 = auVar93._0_8_;
              pSVar45 = pSVar45 + 3;
            }
          }
        }
      }
      local_11f0 = (ulong)((uint)uVar60 & 0xf) - 8;
      if (local_11f0 != 0) {
        uVar60 = uVar60 & 0xfffffffffffffff0;
        local_11e8 = 0;
        do {
          lVar51 = local_11e8 * 0x50;
          pSVar28 = context->scene;
          pGVar29 = (pSVar28->geometries).items[*(uint *)(uVar60 + 0x30 + lVar51)].ptr;
          fVar65 = (pGVar29->time_range).lower;
          fVar92 = (pGVar29->time_range).upper - fVar65;
          fVar126 = ((*(float *)(ray + k * 4 + 0x70) - fVar65) / fVar92) * pGVar29->fnumTimeSegments
          ;
          auVar96 = roundss(ZEXT416((uint)fVar92),ZEXT416((uint)fVar126),9);
          fVar65 = pGVar29->fnumTimeSegments + -1.0;
          if (fVar65 <= auVar96._0_4_) {
            auVar96._0_4_ = fVar65;
          }
          fVar65 = 0.0;
          if (0.0 <= auVar96._0_4_) {
            fVar65 = auVar96._0_4_;
          }
          uVar59 = (ulong)*(uint *)(uVar60 + 4 + lVar51);
          lVar30 = *(long *)(*(long *)&pGVar29[2].numPrimitives + (long)(int)fVar65 * 0x38);
          lVar31 = *(long *)(*(long *)&pGVar29[2].numPrimitives + 0x38 + (long)(int)fVar65 * 0x38);
          pfVar23 = (float *)(lVar30 + (ulong)*(uint *)(uVar60 + lVar51) * 4);
          uVar55 = (ulong)*(uint *)(uVar60 + 0x10 + lVar51);
          pfVar24 = (float *)(lVar30 + uVar55 * 4);
          uVar53 = (ulong)*(uint *)(uVar60 + 0x20 + lVar51);
          puVar1 = (undefined8 *)(lVar30 + uVar53 * 4);
          uVar27 = *puVar1;
          uVar40 = puVar1[1];
          pfVar2 = (float *)(lVar30 + uVar59 * 4);
          uVar47 = (ulong)*(uint *)(uVar60 + 0x14 + lVar51);
          pfVar3 = (float *)(lVar30 + uVar47 * 4);
          uVar50 = *(uint *)(uVar60 + 0x24 + lVar51);
          pfVar4 = (float *)(lVar30 + (ulong)uVar50 * 4);
          uVar54 = (ulong)*(uint *)(uVar60 + 8 + lVar51);
          pfVar5 = (float *)(lVar30 + uVar54 * 4);
          puVar6 = (undefined4 *)(lVar30 + (ulong)*(uint *)(uVar60 + 0x18 + lVar51) * 4);
          uVar57 = (ulong)*(uint *)(uVar60 + 0x28 + lVar51);
          pfVar7 = (float *)(lVar30 + uVar57 * 4);
          uVar58 = (ulong)*(uint *)(uVar60 + 0xc + lVar51);
          pfVar8 = (float *)(lVar30 + uVar58 * 4);
          uVar48 = (ulong)*(uint *)(uVar60 + 0x1c + lVar51);
          puVar9 = (undefined4 *)(lVar30 + uVar48 * 4);
          uVar49 = (ulong)*(uint *)(uVar60 + 0x2c + lVar51);
          pfVar10 = (float *)(lVar30 + uVar49 * 4);
          pfVar11 = (float *)(lVar31 + (ulong)*(uint *)(uVar60 + lVar51) * 4);
          pfVar12 = (float *)(lVar31 + uVar55 * 4);
          fVar126 = fVar126 - fVar65;
          pfVar13 = (float *)(lVar31 + uVar59 * 4);
          pfVar14 = (float *)(lVar31 + uVar54 * 4);
          local_1258 = CONCAT44(*puVar9,*puVar6);
          local_12e8 = (float)uVar27;
          fStack_12e4 = (float)((ulong)uVar27 >> 0x20);
          fStack_12e0 = (float)uVar40;
          pfVar15 = (float *)(lVar31 + uVar58 * 4);
          pfVar16 = (float *)(lVar31 + local_1258 * 4);
          pfVar17 = (float *)(lVar31 + uVar47 * 4);
          pfVar18 = (float *)(lVar31 + uVar48 * 4);
          pfVar19 = (float *)(lVar31 + uVar53 * 4);
          pfVar20 = (float *)(lVar31 + uVar57 * 4);
          pfVar21 = (float *)(lVar31 + (ulong)uVar50 * 4);
          pfVar22 = (float *)(lVar31 + uVar49 * 4);
          fVar166 = 1.0 - fVar126;
          fStack_12dc = (float)((ulong)uVar40 >> 0x20);
          puVar1 = (undefined8 *)(uVar60 + 0x30 + lVar51);
          local_1018 = *puVar1;
          uStack_1010 = puVar1[1];
          puVar1 = (undefined8 *)(uVar60 + 0x40 + lVar51);
          local_1188 = *puVar1;
          uStack_1180 = puVar1[1];
          fVar65 = *(float *)(ray + k * 4);
          fVar92 = *(float *)(ray + k * 4 + 0x10);
          fVar160 = *(float *)(ray + k * 4 + 0x20);
          fVar127 = (*pfVar23 * fVar166 + *pfVar11 * fVar126) - fVar65;
          fVar132 = (*pfVar2 * fVar166 + *pfVar13 * fVar126) - fVar65;
          fVar134 = (*pfVar5 * fVar166 + *pfVar14 * fVar126) - fVar65;
          fVar135 = (*pfVar8 * fVar166 + *pfVar15 * fVar126) - fVar65;
          fVar168 = (pfVar23[1] * fVar166 + pfVar11[1] * fVar126) - fVar92;
          fVar171 = (pfVar2[1] * fVar166 + pfVar13[1] * fVar126) - fVar92;
          fVar173 = (pfVar5[1] * fVar166 + pfVar14[1] * fVar126) - fVar92;
          fVar175 = (pfVar8[1] * fVar166 + pfVar15[1] * fVar126) - fVar92;
          fVar113 = (pfVar23[2] * fVar166 + pfVar11[2] * fVar126) - fVar160;
          fVar121 = (pfVar2[2] * fVar166 + pfVar13[2] * fVar126) - fVar160;
          fStack_1280 = (fStack_1280 * fVar166 + pfVar14[2] * fVar126) - fVar160;
          fStack_127c = (fStack_127c * fVar166 + pfVar15[2] * fVar126) - fVar160;
          fVar136 = (*pfVar24 * fVar166 + *pfVar12 * fVar126) - fVar65;
          fVar139 = (*pfVar3 * fVar166 + *pfVar17 * fVar126) - fVar65;
          fVar140 = (fStack_1260 * fVar166 + *pfVar16 * fVar126) - fVar65;
          fVar177 = (fStack_125c * fVar166 + *pfVar18 * fVar126) - fVar65;
          fVar184 = (pfVar24[1] * fVar166 + pfVar12[1] * fVar126) - fVar92;
          fVar188 = (pfVar3[1] * fVar166 + pfVar17[1] * fVar126) - fVar92;
          fVar191 = ((float)puVar6[1] * fVar166 + pfVar16[1] * fVar126) - fVar92;
          fVar194 = ((float)puVar9[1] * fVar166 + pfVar18[1] * fVar126) - fVar92;
          fVar141 = (pfVar7[2] * fVar166 + pfVar12[2] * fVar126) - fVar160;
          fVar144 = (pfVar10[2] * fVar166 + pfVar17[2] * fVar126) - fVar160;
          fVar148 = (fStack_12d0 * fVar166 + pfVar16[2] * fVar126) - fVar160;
          fVar152 = (fStack_12cc * fVar166 + pfVar18[2] * fVar126) - fVar160;
          fVar142 = (local_12e8 * fVar166 + *pfVar19 * fVar126) - fVar65;
          fVar145 = (*pfVar4 * fVar166 + *pfVar21 * fVar126) - fVar65;
          fVar149 = (*pfVar7 * fVar166 + *pfVar20 * fVar126) - fVar65;
          fVar65 = (*pfVar10 * fVar166 + *pfVar22 * fVar126) - fVar65;
          fVar167 = (fStack_12e4 * fVar166 + pfVar19[1] * fVar126) - fVar92;
          fVar100 = (pfVar4[1] * fVar166 + pfVar21[1] * fVar126) - fVar92;
          fVar101 = (pfVar7[1] * fVar166 + pfVar20[1] * fVar126) - fVar92;
          fVar92 = (pfVar10[1] * fVar166 + pfVar22[1] * fVar126) - fVar92;
          fVar178 = (fVar166 * fStack_12e0 + fVar126 * pfVar19[2]) - fVar160;
          fVar181 = (fVar166 * pfVar4[2] + fVar126 * pfVar21[2]) - fVar160;
          fVar182 = (fVar166 * fStack_12e0 + fVar126 * pfVar20[2]) - fVar160;
          fVar160 = (fVar166 * fStack_12dc + fVar126 * pfVar22[2]) - fVar160;
          fVar107 = fVar142 - fVar127;
          fVar110 = fVar145 - fVar132;
          fVar111 = fVar149 - fVar134;
          fVar112 = fVar65 - fVar135;
          fVar155 = fVar167 - fVar168;
          fVar157 = fVar100 - fVar171;
          fVar158 = fVar101 - fVar173;
          fVar159 = fVar92 - fVar175;
          fVar143 = fVar178 - fVar113;
          fVar146 = fVar181 - fVar121;
          fVar150 = fVar182 - fStack_1280;
          fVar153 = fVar160 - fStack_127c;
          fVar126 = *(float *)(ray + k * 4 + 0x50);
          local_12d8._4_4_ = *(undefined4 *)(ray + k * 4 + 0x60);
          fVar166 = *(float *)(ray + k * 4 + 0x40);
          fVar128 = (fVar155 * (fVar178 + fVar113) - (fVar167 + fVar168) * fVar143) * fVar166 +
                    ((fVar142 + fVar127) * fVar143 - (fVar178 + fVar113) * fVar107) * fVar126 +
                    (fVar107 * (fVar167 + fVar168) - (fVar142 + fVar127) * fVar155) *
                    (float)local_12d8._4_4_;
          fVar133 = (fVar157 * (fVar181 + fVar121) - (fVar100 + fVar171) * fVar146) * fVar166 +
                    ((fVar145 + fVar132) * fVar146 - (fVar181 + fVar121) * fVar110) * fVar126 +
                    (fVar110 * (fVar100 + fVar171) - (fVar145 + fVar132) * fVar157) *
                    (float)local_12d8._4_4_;
          local_1038._0_8_ = CONCAT44(fVar133,fVar128);
          local_1038._8_4_ =
               (fVar158 * (fVar182 + fStack_1280) - (fVar101 + fVar173) * fVar150) * fVar166 +
               ((fVar149 + fVar134) * fVar150 - (fVar182 + fStack_1280) * fVar111) * fVar126 +
               (fVar111 * (fVar101 + fVar173) - (fVar149 + fVar134) * fVar158) *
               (float)local_12d8._4_4_;
          local_1038._12_4_ =
               (fVar159 * (fVar160 + fStack_127c) - (fVar92 + fVar175) * fVar153) * fVar166 +
               ((fVar65 + fVar135) * fVar153 - (fVar160 + fStack_127c) * fVar112) * fVar126 +
               (fVar112 * (fVar92 + fVar175) - (fVar65 + fVar135) * fVar159) *
               (float)local_12d8._4_4_;
          fVar161 = fVar127 - fVar136;
          fVar163 = fVar132 - fVar139;
          fVar164 = fVar134 - fVar140;
          fVar165 = fVar135 - fVar177;
          fVar169 = fVar168 - fVar184;
          fVar172 = fVar171 - fVar188;
          fVar174 = fVar173 - fVar191;
          fVar176 = fVar175 - fVar194;
          fVar185 = fVar113 - fVar141;
          fVar189 = fVar121 - fVar144;
          fVar192 = fStack_1280 - fVar148;
          fVar195 = fStack_127c - fVar152;
          local_1028._0_4_ =
               (fVar169 * (fVar113 + fVar141) - (fVar168 + fVar184) * fVar185) * fVar166 +
               ((fVar127 + fVar136) * fVar185 - (fVar113 + fVar141) * fVar161) * fVar126 +
               (fVar161 * (fVar168 + fVar184) - (fVar127 + fVar136) * fVar169) *
               (float)local_12d8._4_4_;
          local_1028._4_4_ =
               (fVar172 * (fVar121 + fVar144) - (fVar171 + fVar188) * fVar189) * fVar166 +
               ((fVar132 + fVar139) * fVar189 - (fVar121 + fVar144) * fVar163) * fVar126 +
               (fVar163 * (fVar171 + fVar188) - (fVar132 + fVar139) * fVar172) *
               (float)local_12d8._4_4_;
          local_1028._8_4_ =
               (fVar174 * (fStack_1280 + fVar148) - (fVar173 + fVar191) * fVar192) * fVar166 +
               ((fVar134 + fVar140) * fVar192 - (fStack_1280 + fVar148) * fVar164) * fVar126 +
               (fVar164 * (fVar173 + fVar191) - (fVar134 + fVar140) * fVar174) *
               (float)local_12d8._4_4_;
          local_1028._12_4_ =
               (fVar176 * (fStack_127c + fVar152) - (fVar175 + fVar194) * fVar195) * fVar166 +
               ((fVar135 + fVar177) * fVar195 - (fStack_127c + fVar152) * fVar165) * fVar126 +
               (fVar165 * (fVar175 + fVar194) - (fVar135 + fVar177) * fVar176) *
               (float)local_12d8._4_4_;
          fVar186 = fVar136 - fVar142;
          fVar190 = fVar139 - fVar145;
          fVar193 = fVar140 - fVar149;
          fVar196 = fVar177 - fVar65;
          fVar114 = fVar184 - fVar167;
          fVar122 = fVar188 - fVar100;
          fVar123 = fVar191 - fVar101;
          fVar124 = fVar194 - fVar92;
          fVar183 = fVar141 - fVar178;
          fVar147 = fVar144 - fVar181;
          fVar151 = fVar148 - fVar182;
          fVar154 = fVar152 - fVar160;
          local_12d8._0_4_ = local_12d8._4_4_;
          fStack_12d0 = (float)local_12d8._4_4_;
          fStack_12cc = (float)local_12d8._4_4_;
          auVar75._0_4_ =
               (fVar114 * (fVar178 + fVar141) - (fVar167 + fVar184) * fVar183) * fVar166 +
               ((fVar142 + fVar136) * fVar183 - (fVar178 + fVar141) * fVar186) * fVar126 +
               (fVar186 * (fVar167 + fVar184) - (fVar142 + fVar136) * fVar114) *
               (float)local_12d8._4_4_;
          auVar75._4_4_ =
               (fVar122 * (fVar181 + fVar144) - (fVar100 + fVar188) * fVar147) * fVar166 +
               ((fVar145 + fVar139) * fVar147 - (fVar181 + fVar144) * fVar190) * fVar126 +
               (fVar190 * (fVar100 + fVar188) - (fVar145 + fVar139) * fVar122) *
               (float)local_12d8._4_4_;
          auVar75._8_4_ =
               (fVar123 * (fVar182 + fVar148) - (fVar101 + fVar191) * fVar151) * fVar166 +
               ((fVar149 + fVar140) * fVar151 - (fVar182 + fVar148) * fVar193) * fVar126 +
               (fVar193 * (fVar101 + fVar191) - (fVar149 + fVar140) * fVar123) *
               (float)local_12d8._4_4_;
          auVar75._12_4_ =
               (fVar124 * (fVar160 + fVar152) - (fVar92 + fVar194) * fVar154) * fVar166 +
               ((fVar65 + fVar177) * fVar154 - (fVar160 + fVar152) * fVar196) * fVar126 +
               (fVar196 * (fVar92 + fVar194) - (fVar65 + fVar177) * fVar124) *
               (float)local_12d8._4_4_;
          local_1048 = fVar128 + local_1028._0_4_ + auVar75._0_4_;
          fStack_1044 = fVar133 + local_1028._4_4_ + auVar75._4_4_;
          fStack_1040 = local_1038._8_4_ + local_1028._8_4_ + auVar75._8_4_;
          fStack_103c = local_1038._12_4_ + local_1028._12_4_ + auVar75._12_4_;
          auVar84._8_4_ = local_1038._8_4_;
          auVar84._0_8_ = local_1038._0_8_;
          auVar84._12_4_ = local_1038._12_4_;
          auVar85 = minps(auVar84,local_1028);
          auVar85 = minps(auVar85,auVar75);
          auVar179._8_4_ = local_1038._8_4_;
          auVar179._0_8_ = local_1038._0_8_;
          auVar179._12_4_ = local_1038._12_4_;
          auVar93 = maxps(auVar179,local_1028);
          auVar93 = maxps(auVar93,auVar75);
          fVar65 = ABS(local_1048) * 1.1920929e-07;
          fVar92 = ABS(fStack_1044) * 1.1920929e-07;
          fVar160 = ABS(fStack_1040) * 1.1920929e-07;
          fVar167 = ABS(fStack_103c) * 1.1920929e-07;
          auVar180._4_4_ = -(uint)(auVar93._4_4_ <= fVar92);
          auVar180._0_4_ = -(uint)(auVar93._0_4_ <= fVar65);
          auVar180._8_4_ = -(uint)(auVar93._8_4_ <= fVar160);
          auVar180._12_4_ = -(uint)(auVar93._12_4_ <= fVar167);
          auVar86._4_4_ = -(uint)(-fVar92 <= auVar85._4_4_);
          auVar86._0_4_ = -(uint)(-fVar65 <= auVar85._0_4_);
          auVar86._8_4_ = -(uint)(-fVar160 <= auVar85._8_4_);
          auVar86._12_4_ = -(uint)(-fVar167 <= auVar85._12_4_);
          auVar180 = auVar180 | auVar86;
          iVar43 = movmskps(uVar50,auVar180);
          if (iVar43 != 0) {
            auVar138._0_4_ = fVar155 * fVar185 - fVar169 * fVar143;
            auVar138._4_4_ = fVar157 * fVar189 - fVar172 * fVar146;
            auVar138._8_4_ = fVar158 * fVar192 - fVar174 * fVar150;
            auVar138._12_4_ = fVar159 * fVar195 - fVar176 * fVar153;
            auVar156._0_4_ = fVar169 * fVar183 - fVar114 * fVar185;
            auVar156._4_4_ = fVar172 * fVar147 - fVar122 * fVar189;
            auVar156._8_4_ = fVar174 * fVar151 - fVar123 * fVar192;
            auVar156._12_4_ = fVar176 * fVar154 - fVar124 * fVar195;
            auVar76._4_4_ = -(uint)(ABS(fVar172 * fVar146) < ABS(fVar122 * fVar189));
            auVar76._0_4_ = -(uint)(ABS(fVar169 * fVar143) < ABS(fVar114 * fVar185));
            auVar76._8_4_ = -(uint)(ABS(fVar174 * fVar150) < ABS(fVar123 * fVar192));
            auVar76._12_4_ = -(uint)(ABS(fVar176 * fVar153) < ABS(fVar124 * fVar195));
            local_10f8 = blendvps(auVar156,auVar138,auVar76);
            auVar187._0_4_ = fVar186 * fVar185 - fVar161 * fVar183;
            auVar187._4_4_ = fVar190 * fVar189 - fVar163 * fVar147;
            auVar187._8_4_ = fVar193 * fVar192 - fVar164 * fVar151;
            auVar187._12_4_ = fVar196 * fVar195 - fVar165 * fVar154;
            auVar77._4_4_ = -(uint)(ABS(fVar110 * fVar189) < ABS(fVar163 * fVar147));
            auVar77._0_4_ = -(uint)(ABS(fVar107 * fVar185) < ABS(fVar161 * fVar183));
            auVar77._8_4_ = -(uint)(ABS(fVar111 * fVar192) < ABS(fVar164 * fVar151));
            auVar77._12_4_ = -(uint)(ABS(fVar112 * fVar195) < ABS(fVar165 * fVar154));
            auVar36._4_4_ = fVar146 * fVar163 - fVar110 * fVar189;
            auVar36._0_4_ = fVar143 * fVar161 - fVar107 * fVar185;
            auVar36._8_4_ = fVar150 * fVar164 - fVar111 * fVar192;
            auVar36._12_4_ = fVar153 * fVar165 - fVar112 * fVar195;
            local_10e8 = blendvps(auVar187,auVar36,auVar77);
            auVar120._0_4_ = fVar107 * fVar169 - fVar161 * fVar155;
            auVar120._4_4_ = fVar110 * fVar172 - fVar163 * fVar157;
            auVar120._8_4_ = fVar111 * fVar174 - fVar164 * fVar158;
            auVar120._12_4_ = fVar112 * fVar176 - fVar165 * fVar159;
            auVar162._0_4_ = fVar161 * fVar114 - fVar186 * fVar169;
            auVar162._4_4_ = fVar163 * fVar122 - fVar190 * fVar172;
            auVar162._8_4_ = fVar164 * fVar123 - fVar193 * fVar174;
            auVar162._12_4_ = fVar165 * fVar124 - fVar196 * fVar176;
            auVar78._4_4_ = -(uint)(ABS(fVar163 * fVar157) < ABS(fVar190 * fVar172));
            auVar78._0_4_ = -(uint)(ABS(fVar161 * fVar155) < ABS(fVar186 * fVar169));
            auVar78._8_4_ = -(uint)(ABS(fVar164 * fVar158) < ABS(fVar193 * fVar174));
            auVar78._12_4_ = -(uint)(ABS(fVar165 * fVar159) < ABS(fVar196 * fVar176));
            local_10d8 = blendvps(auVar162,auVar120,auVar78);
            fVar107 = fVar166 * local_10f8._0_4_ +
                      fVar126 * local_10e8._0_4_ + (float)local_12d8._4_4_ * local_10d8._0_4_;
            fVar110 = fVar166 * local_10f8._4_4_ +
                      fVar126 * local_10e8._4_4_ + (float)local_12d8._4_4_ * local_10d8._4_4_;
            fVar111 = fVar166 * local_10f8._8_4_ +
                      fVar126 * local_10e8._8_4_ + (float)local_12d8._4_4_ * local_10d8._8_4_;
            fVar112 = fVar166 * local_10f8._12_4_ +
                      fVar126 * local_10e8._12_4_ + (float)local_12d8._4_4_ * local_10d8._12_4_;
            fVar107 = fVar107 + fVar107;
            fVar110 = fVar110 + fVar110;
            fVar111 = fVar111 + fVar111;
            fVar112 = fVar112 + fVar112;
            auVar79._0_4_ = fVar113 * local_10d8._0_4_;
            auVar79._4_4_ = fVar121 * local_10d8._4_4_;
            auVar79._8_4_ = fStack_1280 * local_10d8._8_4_;
            auVar79._12_4_ = fStack_127c * local_10d8._12_4_;
            fVar166 = fVar127 * local_10f8._0_4_ + fVar168 * local_10e8._0_4_ + auVar79._0_4_;
            fVar167 = fVar132 * local_10f8._4_4_ + fVar171 * local_10e8._4_4_ + auVar79._4_4_;
            fVar100 = fVar134 * local_10f8._8_4_ + fVar173 * local_10e8._8_4_ + auVar79._8_4_;
            fVar101 = fVar135 * local_10f8._12_4_ + fVar175 * local_10e8._12_4_ + auVar79._12_4_;
            auVar39._4_4_ = fVar110;
            auVar39._0_4_ = fVar107;
            auVar39._8_4_ = fVar111;
            auVar39._12_4_ = fVar112;
            auVar85 = rcpps(auVar79,auVar39);
            fVar65 = auVar85._0_4_;
            fVar92 = auVar85._4_4_;
            fVar126 = auVar85._8_4_;
            fVar160 = auVar85._12_4_;
            fVar166 = ((1.0 - fVar107 * fVar65) * fVar65 + fVar65) * (fVar166 + fVar166);
            fVar167 = ((1.0 - fVar110 * fVar92) * fVar92 + fVar92) * (fVar167 + fVar167);
            fVar126 = ((1.0 - fVar111 * fVar126) * fVar126 + fVar126) * (fVar100 + fVar100);
            fVar160 = ((1.0 - fVar112 * fVar160) * fVar160 + fVar160) * (fVar101 + fVar101);
            fVar65 = *(float *)(ray + k * 4 + 0x80);
            fVar92 = *(float *)(ray + k * 4 + 0x30);
            auVar87._4_4_ = -(uint)(fVar92 <= fVar167);
            auVar87._0_4_ = -(uint)(fVar92 <= fVar166);
            auVar87._8_4_ = -(uint)(fVar92 <= fVar126);
            auVar87._12_4_ = -(uint)(fVar92 <= fVar160);
            auVar80._0_4_ = -(uint)(fVar166 <= fVar65 && fVar92 <= fVar166) & auVar180._0_4_;
            auVar80._4_4_ = -(uint)(fVar167 <= fVar65 && fVar92 <= fVar167) & auVar180._4_4_;
            auVar80._8_4_ = -(uint)(fVar126 <= fVar65 && fVar92 <= fVar126) & auVar180._8_4_;
            auVar80._12_4_ = -(uint)(fVar160 <= fVar65 && fVar92 <= fVar160) & auVar180._12_4_;
            iVar43 = movmskps(iVar43,auVar80);
            fStack_1260 = fVar151;
            fStack_125c = fVar154;
            if (iVar43 != 0) {
              valid.field_0.i[0] = auVar80._0_4_ & -(uint)(fVar107 != 0.0);
              valid.field_0.i[1] = auVar80._4_4_ & -(uint)(fVar110 != 0.0);
              valid.field_0.i[2] = auVar80._8_4_ & -(uint)(fVar111 != 0.0);
              valid.field_0.i[3] = auVar80._12_4_ & -(uint)(fVar112 != 0.0);
              iVar43 = movmskps(iVar43,(undefined1  [16])valid.field_0);
              if (iVar43 != 0) {
                tNear.field_0.v[2] = local_1038._8_4_;
                tNear.field_0._0_8_ = local_1038._0_8_;
                tNear.field_0.v[3] = local_1038._12_4_;
                auVar41._4_4_ = fStack_1044;
                auVar41._0_4_ = local_1048;
                auVar41._8_4_ = fStack_1040;
                auVar41._12_4_ = fStack_103c;
                local_1108[0] = fVar166;
                local_1108[1] = fVar167;
                local_1108[2] = fVar126;
                local_1108[3] = fVar160;
                auVar85 = rcpps(auVar87,auVar41);
                fVar92 = auVar85._0_4_;
                fVar100 = auVar85._4_4_;
                fVar101 = auVar85._8_4_;
                fVar107 = auVar85._12_4_;
                fVar92 = (float)(-(uint)(1e-18 <= ABS(local_1048)) &
                                (uint)(((float)DAT_01f7ba10 - local_1048 * fVar92) * fVar92 + fVar92
                                      ));
                fVar100 = (float)(-(uint)(1e-18 <= ABS(fStack_1044)) &
                                 (uint)((DAT_01f7ba10._4_4_ - fStack_1044 * fVar100) * fVar100 +
                                       fVar100));
                fVar101 = (float)(-(uint)(1e-18 <= ABS(fStack_1040)) &
                                 (uint)((DAT_01f7ba10._8_4_ - fStack_1040 * fVar101) * fVar101 +
                                       fVar101));
                fVar107 = (float)(-(uint)(1e-18 <= ABS(fStack_103c)) &
                                 (uint)((DAT_01f7ba10._12_4_ - fStack_103c * fVar107) * fVar107 +
                                       fVar107));
                auVar131._0_4_ = fVar128 * fVar92;
                auVar131._4_4_ = fVar133 * fVar100;
                auVar131._8_4_ = local_1038._8_4_ * fVar101;
                auVar131._12_4_ = local_1038._12_4_ * fVar107;
                local_1128 = minps(auVar131,_DAT_01f7ba10);
                auVar170._0_4_ = fVar92 * local_1028._0_4_;
                auVar170._4_4_ = fVar100 * local_1028._4_4_;
                auVar170._8_4_ = fVar101 * local_1028._8_4_;
                auVar170._12_4_ = fVar107 * local_1028._12_4_;
                local_1118 = minps(auVar170,_DAT_01f7ba10);
                auVar37._4_4_ = fVar167;
                auVar37._0_4_ = fVar166;
                auVar37._8_4_ = fVar126;
                auVar37._12_4_ = fVar160;
                auVar93 = blendvps(_DAT_01f7a9f0,auVar37,(undefined1  [16])valid.field_0);
                auVar105._4_4_ = auVar93._0_4_;
                auVar105._0_4_ = auVar93._4_4_;
                auVar105._8_4_ = auVar93._12_4_;
                auVar105._12_4_ = auVar93._8_4_;
                auVar85 = minps(auVar105,auVar93);
                auVar88._0_8_ = auVar85._8_8_;
                auVar88._8_4_ = auVar85._0_4_;
                auVar88._12_4_ = auVar85._4_4_;
                auVar85 = minps(auVar88,auVar85);
                uVar50 = -(uint)(auVar85._0_4_ == auVar93._0_4_);
                uVar62 = -(uint)(auVar85._4_4_ == auVar93._4_4_);
                uVar63 = -(uint)(auVar85._8_4_ == auVar93._8_4_);
                uVar64 = -(uint)(auVar85._12_4_ == auVar93._12_4_);
                auVar99._4_4_ = uVar62;
                auVar99._0_4_ = uVar50;
                auVar97._0_4_ = uVar50 & valid.field_0.i[0];
                auVar97._4_4_ = uVar62 & valid.field_0.i[1];
                auVar97._8_4_ = uVar63 & valid.field_0.i[2];
                auVar97._12_4_ = uVar64 & valid.field_0.i[3];
                iVar43 = movmskps((int)&mapUV,auVar97);
                auVar98._8_4_ = 0xffffffff;
                auVar98._0_8_ = 0xffffffffffffffff;
                auVar98._12_4_ = 0xffffffff;
                if (iVar43 != 0) {
                  auVar99._8_4_ = uVar63;
                  auVar99._12_4_ = uVar64;
                  auVar98 = auVar99;
                }
                auVar81._0_4_ = valid.field_0.i[0] & auVar98._0_4_;
                auVar81._4_4_ = valid.field_0.i[1] & auVar98._4_4_;
                auVar81._8_4_ = valid.field_0.i[2] & auVar98._8_4_;
                auVar81._12_4_ = valid.field_0.i[3] & auVar98._12_4_;
                uVar44 = movmskps(iVar43,auVar81);
                uVar47 = CONCAT44((int)((ulong)&mapUV >> 0x20),uVar44);
                lVar51 = 0;
                auVar85 = ZEXT416((uint)fVar65);
                if (uVar47 != 0) {
                  for (; (uVar47 >> lVar51 & 1) == 0; lVar51 = lVar51 + 1) {
                  }
                }
LAB_0026134a:
                local_fa8 = *(uint *)((long)&local_1018 + lVar51 * 4);
                pRVar46 = (RTCRayN *)(ulong)local_fa8;
                pGVar29 = (pSVar28->geometries).items[(long)pRVar46].ptr;
                auVar93 = auVar85;
                if ((pGVar29->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  valid.field_0.v[lVar51] = 0.0;
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar29->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar44 = *(undefined4 *)(local_1128 + lVar51 * 4);
                    fVar65 = local_1108[lVar51 + -4];
                    *(float *)(ray + k * 4 + 0x80) = local_1108[lVar51];
                    *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_10f8 + lVar51 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_10e8 + lVar51 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_10d8 + lVar51 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xf0) = uVar44;
                    *(float *)(ray + k * 4 + 0x100) = fVar65;
                    *(undefined4 *)(ray + k * 4 + 0x110) =
                         *(undefined4 *)((long)&local_1188 + lVar51 * 4);
                    *(uint *)(ray + k * 4 + 0x120) = local_fa8;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    goto LAB_002617e3;
                  }
                  local_fd8 = *(undefined4 *)(local_1128 + lVar51 * 4);
                  local_fc8 = local_1108[lVar51 + -4];
                  uVar44 = *(undefined4 *)(local_10f8 + lVar51 * 4);
                  uVar25 = *(undefined4 *)(local_10e8 + lVar51 * 4);
                  uVar26 = *(undefined4 *)((long)&local_1188 + lVar51 * 4);
                  local_fb8._4_4_ = uVar26;
                  local_fb8._0_4_ = uVar26;
                  local_fb8._8_4_ = uVar26;
                  local_fb8._12_4_ = uVar26;
                  local_ff8._4_4_ = uVar25;
                  local_ff8._0_4_ = uVar25;
                  local_ff8._8_4_ = uVar25;
                  local_ff8._12_4_ = uVar25;
                  uVar25 = *(undefined4 *)(local_10d8 + lVar51 * 4);
                  local_fe8._4_4_ = uVar25;
                  local_fe8._0_4_ = uVar25;
                  local_fe8._8_4_ = uVar25;
                  local_fe8._12_4_ = uVar25;
                  local_1008[0] = (RTCHitN)(char)uVar44;
                  local_1008[1] = (RTCHitN)(char)((uint)uVar44 >> 8);
                  local_1008[2] = (RTCHitN)(char)((uint)uVar44 >> 0x10);
                  local_1008[3] = (RTCHitN)(char)((uint)uVar44 >> 0x18);
                  local_1008[4] = (RTCHitN)(char)uVar44;
                  local_1008[5] = (RTCHitN)(char)((uint)uVar44 >> 8);
                  local_1008[6] = (RTCHitN)(char)((uint)uVar44 >> 0x10);
                  local_1008[7] = (RTCHitN)(char)((uint)uVar44 >> 0x18);
                  local_1008[8] = (RTCHitN)(char)uVar44;
                  local_1008[9] = (RTCHitN)(char)((uint)uVar44 >> 8);
                  local_1008[10] = (RTCHitN)(char)((uint)uVar44 >> 0x10);
                  local_1008[0xb] = (RTCHitN)(char)((uint)uVar44 >> 0x18);
                  local_1008[0xc] = (RTCHitN)(char)uVar44;
                  local_1008[0xd] = (RTCHitN)(char)((uint)uVar44 >> 8);
                  local_1008[0xe] = (RTCHitN)(char)((uint)uVar44 >> 0x10);
                  local_1008[0xf] = (RTCHitN)(char)((uint)uVar44 >> 0x18);
                  uStack_fd4 = local_fd8;
                  uStack_fd0 = local_fd8;
                  uStack_fcc = local_fd8;
                  fStack_fc4 = local_fc8;
                  fStack_fc0 = local_fc8;
                  fStack_fbc = local_fc8;
                  uStack_fa4 = local_fa8;
                  uStack_fa0 = local_fa8;
                  uStack_f9c = local_fa8;
                  local_f98 = context->user->instID[0];
                  uStack_f94 = local_f98;
                  uStack_f90 = local_f98;
                  uStack_f8c = local_f98;
                  local_f88 = context->user->instPrimID[0];
                  uStack_f84 = local_f88;
                  uStack_f80 = local_f88;
                  uStack_f7c = local_f88;
                  *(float *)(ray + k * 4 + 0x80) = local_1108[lVar51];
                  local_1208 = *local_11f8;
                  args.valid = (int *)local_1208;
                  args.geometryUserPtr = pGVar29->userPtr;
                  args.context = context->user;
                  args.hit = local_1008;
                  args.N = 4;
                  pRVar46 = (RTCRayN *)pGVar29->intersectionFilterN;
                  args.ray = (RTCRayN *)ray;
                  if (pRVar46 != (RTCRayN *)0x0) {
                    pRVar46 = (RTCRayN *)(*(code *)pRVar46)(&args);
                  }
                  if (local_1208 == (undefined1  [16])0x0) {
                    auVar89._8_4_ = 0xffffffff;
                    auVar89._0_8_ = 0xffffffffffffffff;
                    auVar89._12_4_ = 0xffffffff;
                    auVar89 = auVar89 ^ _DAT_01f7ae20;
                  }
                  else {
                    pRVar46 = (RTCRayN *)context->args->filter;
                    if ((pRVar46 != (RTCRayN *)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar29->field_8).field_0x2 & 0x40) != 0)))) {
                      pRVar46 = (RTCRayN *)(*(code *)pRVar46)(&args);
                    }
                    auVar82._0_4_ = -(uint)(local_1208._0_4_ == 0);
                    auVar82._4_4_ = -(uint)(local_1208._4_4_ == 0);
                    auVar82._8_4_ = -(uint)(local_1208._8_4_ == 0);
                    auVar82._12_4_ = -(uint)(local_1208._12_4_ == 0);
                    auVar89 = auVar82 ^ _DAT_01f7ae20;
                    if (local_1208 != (undefined1  [16])0x0) {
                      auVar102 = blendvps(*(undefined1 (*) [16])args.hit,
                                          *(undefined1 (*) [16])(args.ray + 0xc0),auVar82);
                      *(undefined1 (*) [16])(args.ray + 0xc0) = auVar102;
                      auVar102 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                          *(undefined1 (*) [16])(args.ray + 0xd0),auVar82);
                      *(undefined1 (*) [16])(args.ray + 0xd0) = auVar102;
                      auVar102 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                          *(undefined1 (*) [16])(args.ray + 0xe0),auVar82);
                      *(undefined1 (*) [16])(args.ray + 0xe0) = auVar102;
                      auVar102 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                          *(undefined1 (*) [16])(args.ray + 0xf0),auVar82);
                      *(undefined1 (*) [16])(args.ray + 0xf0) = auVar102;
                      auVar102 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                          *(undefined1 (*) [16])(args.ray + 0x100),auVar82);
                      *(undefined1 (*) [16])(args.ray + 0x100) = auVar102;
                      auVar102 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                          *(undefined1 (*) [16])(args.ray + 0x110),auVar82);
                      *(undefined1 (*) [16])(args.ray + 0x110) = auVar102;
                      auVar102 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                          *(undefined1 (*) [16])(args.ray + 0x120),auVar82);
                      *(undefined1 (*) [16])(args.ray + 0x120) = auVar102;
                      auVar102 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                          *(undefined1 (*) [16])(args.ray + 0x130),auVar82);
                      *(undefined1 (*) [16])(args.ray + 0x130) = auVar102;
                      auVar102 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                          *(undefined1 (*) [16])(args.ray + 0x140),auVar82);
                      *(undefined1 (*) [16])(args.ray + 0x140) = auVar102;
                      pRVar46 = args.ray;
                    }
                  }
                  if ((_DAT_01f7bb20 & auVar89) == (undefined1  [16])0x0) {
                    *(int *)(ray + k * 4 + 0x80) = auVar85._0_4_;
                  }
                  else {
                    auVar93 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                  }
                  valid.field_0.v[lVar51] = 0.0;
                  fVar65 = auVar93._0_4_;
                  valid.field_0.i[0] = -(uint)(fVar166 <= fVar65) & valid.field_0.i[0];
                  valid.field_0.i[1] = -(uint)(fVar167 <= fVar65) & valid.field_0.i[1];
                  valid.field_0.i[2] = -(uint)(fVar126 <= fVar65) & valid.field_0.i[2];
                  valid.field_0.i[3] = -(uint)(fVar160 <= fVar65) & valid.field_0.i[3];
                  _local_12d8 = auVar85;
                }
                iVar43 = movmskps((int)pRVar46,(undefined1  [16])valid.field_0);
                if (iVar43 == 0) goto LAB_002617e3;
                auVar38._4_4_ = fVar167;
                auVar38._0_4_ = fVar166;
                auVar38._8_4_ = fVar126;
                auVar38._12_4_ = fVar160;
                auVar102 = blendvps(_DAT_01f7a9f0,auVar38,(undefined1  [16])valid.field_0);
                auVar106._4_4_ = auVar102._0_4_;
                auVar106._0_4_ = auVar102._4_4_;
                auVar106._8_4_ = auVar102._12_4_;
                auVar106._12_4_ = auVar102._8_4_;
                auVar85 = minps(auVar106,auVar102);
                auVar90._0_8_ = auVar85._8_8_;
                auVar90._8_4_ = auVar85._0_4_;
                auVar90._12_4_ = auVar85._4_4_;
                auVar85 = minps(auVar90,auVar85);
                auVar91._0_8_ =
                     CONCAT44(-(uint)(auVar85._4_4_ == auVar102._4_4_) & valid.field_0._4_4_,
                              -(uint)(auVar85._0_4_ == auVar102._0_4_) & valid.field_0._0_4_);
                auVar91._8_4_ = -(uint)(auVar85._8_4_ == auVar102._8_4_) & valid.field_0._8_4_;
                auVar91._12_4_ = -(uint)(auVar85._12_4_ == auVar102._12_4_) & valid.field_0._12_4_;
                iVar43 = movmskps(iVar43,auVar91);
                aVar83 = valid.field_0;
                if (iVar43 != 0) {
                  aVar83.i[2] = auVar91._8_4_;
                  aVar83._0_8_ = auVar91._0_8_;
                  aVar83.i[3] = auVar91._12_4_;
                }
                uVar44 = movmskps(iVar43,(undefined1  [16])aVar83);
                uVar47 = CONCAT44((int)((ulong)pRVar46 >> 0x20),uVar44);
                lVar51 = 0;
                auVar85 = auVar93;
                if (uVar47 != 0) {
                  for (; (uVar47 >> lVar51 & 1) == 0; lVar51 = lVar51 + 1) {
                  }
                }
                goto LAB_0026134a;
              }
            }
          }
LAB_002617e3:
          local_11e8 = local_11e8 + 1;
        } while (local_11e8 != local_11f0);
      }
      uVar44 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar85._4_4_ = uVar44;
      auVar85._0_4_ = uVar44;
      auVar85._8_4_ = uVar44;
      auVar85._12_4_ = uVar44;
      fVar100 = local_1058;
      fVar101 = fStack_1054;
      fVar107 = fStack_1050;
      fVar65 = fStack_104c;
      fVar110 = local_1068;
      fVar111 = fStack_1064;
      fVar112 = fStack_1060;
      fVar92 = fStack_105c;
      fVar113 = local_1098;
      fVar114 = fStack_1094;
      fVar121 = fStack_1090;
      fVar166 = fStack_108c;
      fVar122 = local_1078;
      fVar123 = fStack_1074;
      fVar124 = fStack_1070;
      fVar126 = fStack_106c;
      fVar127 = local_1088;
      fVar128 = fStack_1084;
      fVar132 = fStack_1080;
      fVar160 = fStack_107c;
      fVar133 = local_10a8;
      fVar134 = fStack_10a4;
      fVar135 = fStack_10a0;
      fVar167 = fStack_109c;
      fVar136 = local_10b8;
      fVar139 = fStack_10b4;
      fVar140 = fStack_10b0;
      fVar177 = fStack_10ac;
      fVar141 = local_10c8;
      fVar142 = fStack_10c4;
      fVar143 = fStack_10c0;
      fVar183 = fStack_10bc;
    }
    if (pSVar45 == stack) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }